

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O2

void __thiscall
features::NearestNeighbor<short>::find(NearestNeighbor<short> *this,short *query,Result *result)

{
  short *psVar1;
  short *psVar2;
  ulong uVar3;
  int iVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  short sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  
  result->index_2nd_best = 0;
  result->dist_1st_best = 0;
  result->dist_2nd_best = 0;
  result->index_1st_best = 0;
  lVar8 = *(long *)(this + 8);
  iVar7 = *(int *)(this + 4);
  uVar3 = (long)*(int *)this / 8 & 0xffffffff;
  iVar4 = 0;
  if ((int)((long)*(int *)this / 8) < 1) {
    uVar3 = 0;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  iVar6 = 0;
  iVar10 = 0;
  iVar11 = 0;
  while( true ) {
    sVar5 = (short)iVar6;
    sVar9 = (short)iVar10;
    if (iVar11 == iVar7) break;
    sVar15 = 0;
    sVar16 = 0;
    sVar17 = 0;
    sVar18 = 0;
    sVar19 = 0;
    sVar20 = 0;
    sVar21 = 0;
    sVar22 = 0;
    lVar13 = 0;
    uVar14 = uVar3;
    while (iVar12 = (int)uVar14, uVar14 = (ulong)(iVar12 - 1), iVar12 != 0) {
      psVar1 = (short *)(lVar8 + lVar13);
      psVar2 = (short *)((long)query + lVar13);
      sVar15 = sVar15 + *psVar1 * *psVar2;
      sVar16 = sVar16 + psVar1[1] * psVar2[1];
      sVar17 = sVar17 + psVar1[2] * psVar2[2];
      sVar18 = sVar18 + psVar1[3] * psVar2[3];
      sVar19 = sVar19 + psVar1[4] * psVar2[4];
      sVar20 = sVar20 + psVar1[5] * psVar2[5];
      sVar21 = sVar21 + psVar1[6] * psVar2[6];
      sVar22 = sVar22 + psVar1[7] * psVar2[7];
      lVar13 = lVar13 + 0x10;
    }
    iVar12 = (int)sVar22 +
             (int)sVar21 + (int)sVar20 + (int)sVar19 +
             (int)sVar18 + (int)sVar17 + (int)sVar16 + (int)sVar15;
    if (sVar9 <= iVar12) {
      if (iVar12 < sVar5) {
        result->index_2nd_best = iVar11;
        result->dist_2nd_best = (short)iVar12;
        iVar10 = iVar12;
      }
      else {
        result->index_2nd_best = iVar4;
        result->dist_2nd_best = sVar5;
        result->index_1st_best = iVar11;
        result->dist_1st_best = (short)iVar12;
        iVar4 = iVar11;
        iVar10 = iVar6;
        iVar6 = iVar12;
      }
    }
    lVar8 = lVar8 + uVar3 * 0x10;
    iVar11 = iVar11 + 1;
  }
  sVar15 = 0;
  if (0 < sVar5) {
    sVar15 = sVar5;
  }
  if (0x3f00 < sVar15) {
    sVar15 = 0x3f01;
  }
  if (sVar9 < 1) {
    sVar9 = 0;
  }
  if (0x3f00 < sVar9) {
    sVar9 = 0x3f01;
  }
  result->dist_1st_best = sVar15 * -2 + 0x7e02;
  result->dist_2nd_best = sVar9 * -2 + 0x7e02;
  return;
}

Assistant:

void
NearestNeighbor<short>::find (short const* query,
    NearestNeighbor<short>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0;
    result->dist_2nd_best = 0;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    short_inner_prod<short>(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual square distances.
     * The distance with 'signed char' vectors is: 2 * 127^2 - 2 * <Q, Ci>.
     * The maximum distance is (2*127)^2, which unfortunately does not fit
     * in a signed short. Therefore, the distance is clapmed at 127^2.
     */
    result->dist_1st_best = std::min(16129, std::max(0, (int)result->dist_1st_best));
    result->dist_2nd_best = std::min(16129, std::max(0, (int)result->dist_2nd_best));
    result->dist_1st_best = 32258 - 2 * result->dist_1st_best;
    result->dist_2nd_best = 32258 - 2 * result->dist_2nd_best;
}